

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

void __thiscall LongReadsMapper::update_indexes(LongReadsMapper *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  uint uVar1;
  pointer pLVar2;
  pointer plVar3;
  long lVar4;
  pointer pvVar5;
  pointer puVar6;
  iterator __position;
  bool bVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  pointer pLVar12;
  long lVar13;
  pointer pLVar14;
  LongReadMapping *other;
  unsigned_long local_38;
  
  pLVar12 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar14 = pLVar2;
  if (pLVar12 != pLVar2) {
    do {
      other = pLVar12;
      pLVar12 = other + 1;
      if (pLVar12 == pLVar2) break;
      bVar7 = LongReadMapping::operator<(pLVar12,other);
    } while (!bVar7);
    pLVar14 = other + 1;
  }
  if (pLVar14 != pLVar2) {
    poVar8 = sdglib::OutputLog(INFO,true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Sorting mappings",0x10);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pLVar12 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pLVar12 != pLVar2) {
      uVar9 = (long)pLVar2 - (long)pLVar12 >> 5;
      lVar13 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pLVar12,pLVar2,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pLVar12,pLVar2);
    }
  }
  this_01 = &this->reads_in_node;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(this_01,(this->reads_in_node).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_01,((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  this_00 = &this->first_mapping;
  plVar3 = (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar3) {
    (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar3;
  }
  local_38 = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::resize
            (this_00,(long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4,(value_type_conflict *)&local_38);
  pLVar12 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar12) {
    lVar13 = 8;
    uVar9 = 0;
    do {
      uVar1 = *(uint *)((long)&pLVar12->node + lVar13);
      if ((ulong)((long)(this->first_mapping).super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->first_mapping).super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar1) {
        local_38 = 0xffffffffffffffff;
        std::vector<long,_std::allocator<long>_>::resize
                  (this_00,(ulong)(uVar1 + 1),(value_type_conflict *)&local_38);
      }
      uVar10 = (ulong)*(uint *)((long)&pLVar12->node + lVar13);
      plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (plVar3[uVar10] == -1) {
        plVar3[uVar10] = uVar9;
      }
      lVar4 = *(long *)((long)pLVar12 + lVar13 + -8);
      lVar11 = -lVar4;
      if (0 < lVar4) {
        lVar11 = lVar4;
      }
      pvVar5 = (this_01->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar6 = *(pointer *)
                ((long)&pvVar5[lVar11].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      if ((pvVar5[lVar11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start == puVar6) || (puVar6[-1] != uVar10)) {
        this_02 = pvVar5 + lVar11;
        local_38 = (unsigned_long)*(uint *)((long)&pLVar12->node + lVar13);
        __position._M_current =
             (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(this_02,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar9 = uVar9 + 1;
      pLVar12 = (this->mappings).
                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar9 < (ulong)((long)(this->mappings).
                                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar12 >> 5))
    ;
  }
  return;
}

Assistant:

void LongReadsMapper::update_indexes() {
    if (!std::is_sorted(mappings.begin(), mappings.end())) {
        sdglib::OutputLog() << "Sorting mappings" << std::endl;
        sdglib::sort(mappings.begin(), mappings.end());
    }
    reads_in_node.clear();
    reads_in_node.resize(sg.nodes.size());
    first_mapping.clear();
    first_mapping.resize(datastore.size()+1,-1);
    for (int64_t i=0;i<mappings.size();++i){
        auto &m=mappings[i];
        if (first_mapping.size()<=m.read_id) first_mapping.resize(m.read_id+1,-1);
        if (first_mapping[m.read_id]==-1) first_mapping[m.read_id]=i;
        if (reads_in_node[std::abs(m.node)].empty() or reads_in_node[std::abs(m.node)].back()!=m.read_id)
            reads_in_node[std::abs(m.node)].push_back(m.read_id);
    }
}